

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O1

string * __thiscall
cmQtAutoGen::FileNameWithoutLastExtension_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGen *this,string_view filename)

{
  cmQtAutoGen *pcVar1;
  cmQtAutoGen *pcVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  cmQtAutoGen *pcVar6;
  bool bVar7;
  
  sVar4 = filename._M_len;
  if (this == (cmQtAutoGen *)0x0) {
LAB_005596fa:
    pcVar6 = (cmQtAutoGen *)0x0;
  }
  else {
    pcVar2 = this + 1;
    do {
      if (pcVar2 == (cmQtAutoGen *)&DAT_00000001) goto LAB_005596fa;
      pcVar6 = pcVar2 + -1;
      pcVar1 = pcVar2 + (sVar4 - 2);
      pcVar2 = pcVar6;
    } while (*pcVar1 != (cmQtAutoGen)0x2f);
  }
  uVar3 = (long)this - (long)pcVar6;
  if (uVar3 == 0) {
LAB_00559722:
    uVar5 = 0xffffffffffffffff;
  }
  else {
    pcVar2 = this + sVar4;
    uVar5 = uVar3;
    do {
      pcVar2 = pcVar2 + -1;
      bVar7 = uVar5 == 0;
      uVar5 = uVar5 - 1;
      if (bVar7) goto LAB_00559722;
    } while (*pcVar2 != (cmQtAutoGen)0x2e);
  }
  if (uVar3 < uVar5) {
    uVar5 = uVar3;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar6 + sVar4,pcVar6 + sVar4 + uVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::FileNameWithoutLastExtension(cm::string_view filename)
{
  auto slashPos = filename.rfind('/');
  if (slashPos != cm::string_view::npos) {
    filename.remove_prefix(slashPos + 1);
  }
  auto dotPos = filename.rfind('.');
  return std::string(filename.substr(0, dotPos));
}